

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

ostream * __thiscall wasm::anon_unknown_0::TypePrinter::print(TypePrinter *this,Type type)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Tuple *tuple;
  ostream *poVar4;
  char *pcVar5;
  HeapType local_20;
  HeapType heapType;
  Type type_local;
  
  heapType.id = type.id;
  if (type.id < 7) {
    BVar2 = wasm::Type::getBasic((Type *)&heapType);
    switch(BVar2) {
    case none:
      poVar4 = this->os;
      pcVar5 = "none";
      break;
    case unreachable:
      poVar4 = this->os;
      pcVar5 = "unreachable";
      break;
    case i32:
      poVar4 = this->os;
      pcVar5 = "i32";
      break;
    case i64:
      poVar4 = this->os;
      pcVar5 = "i64";
      break;
    case f32:
      poVar4 = this->os;
      pcVar5 = "f32";
      break;
    case f64:
      poVar4 = this->os;
      pcVar5 = "f64";
      break;
    case v128:
      poVar4 = this->os;
      pcVar5 = "v128";
      break;
    default:
      goto switchD_00a36978_default;
    }
LAB_00a36ab4:
    poVar4 = std::operator<<(poVar4,pcVar5);
  }
  else {
switchD_00a36978_default:
    bVar1 = isTemp((Type)heapType.id);
    if (bVar1) {
      std::operator<<(this->os,"(; temp ;) ");
    }
    bVar1 = wasm::Type::isTuple((Type *)&heapType);
    if (bVar1) {
      tuple = wasm::Type::getTuple((Type *)&heapType);
      print(this,tuple);
    }
    else {
      bVar1 = wasm::Type::isRef((Type *)&heapType);
      if (!bVar1) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x769);
      }
      local_20 = wasm::Type::getHeapType((Type *)&heapType);
      if (((local_20.id < 0xe) && (bVar1 = wasm::Type::isNullable((Type *)&heapType), bVar1)) &&
         (BVar3 = HeapType::getBasic(&local_20), BVar3 < (noext|any))) {
        pcVar5 = &DAT_00be88d0 + *(int *)(&DAT_00be88d0 + (ulong)BVar3 * 4);
        poVar4 = this->os;
        goto LAB_00a36ab4;
      }
      std::operator<<(this->os,"(ref ");
      bVar1 = wasm::Type::isNullable((Type *)&heapType);
      if (bVar1) {
        std::operator<<(this->os,"null ");
      }
      printHeapTypeName(this,local_20);
      std::operator<<(this->os,')');
    }
    poVar4 = this->os;
  }
  return poVar4;
}

Assistant:

std::ostream& TypePrinter::print(Type type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::none:
        return os << "none";
      case Type::unreachable:
        return os << "unreachable";
      case Type::i32:
        return os << "i32";
      case Type::i64:
        return os << "i64";
      case Type::f32:
        return os << "f32";
      case Type::f64:
        return os << "f64";
      case Type::v128:
        return os << "v128";
    }
  }

  if (isTemp(type)) {
    os << "(; temp ;) ";
  }
#if TRACE_CANONICALIZATION
  os << "(;" << ((type.getID() >> 4) % 1000) << ";) ";
#endif
  if (type.isTuple()) {
    print(type.getTuple());
  } else if (type.isRef()) {
    auto heapType = type.getHeapType();
    if (heapType.isBasic()) {
      // Print shorthands for certain basic heap types.
      if (type.isNullable()) {
        switch (heapType.getBasic()) {
          case HeapType::ext:
            return os << "externref";
          case HeapType::func:
            return os << "funcref";
          case HeapType::any:
            return os << "anyref";
          case HeapType::eq:
            return os << "eqref";
          case HeapType::i31:
            return os << "i31ref";
          case HeapType::struct_:
            return os << "structref";
          case HeapType::array:
            return os << "arrayref";
          case HeapType::string:
            return os << "stringref";
          case HeapType::stringview_wtf8:
            return os << "stringview_wtf8";
          case HeapType::stringview_wtf16:
            return os << "stringview_wtf16";
          case HeapType::stringview_iter:
            return os << "stringview_iter";
          case HeapType::none:
            return os << "nullref";
          case HeapType::noext:
            return os << "nullexternref";
          case HeapType::nofunc:
            return os << "nullfuncref";
        }
      }
    }
    os << "(ref ";
    if (type.isNullable()) {
      os << "null ";
    }
    printHeapTypeName(heapType);
    os << ')';
  } else {
    WASM_UNREACHABLE("unexpected type");
  }
  return os;
}